

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

bool __thiscall cmCacheManager::CacheIterator::GetPropertyAsBool(CacheIterator *this,string *prop)

{
  _Base_ptr p_Var1;
  byte bVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *val;
  
  p_Var1 = (this->Position)._M_node;
  p_Var3 = &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 == p_Var3) {
    val = (_Rb_tree_header *)0x0;
  }
  else {
    p_Var3 = (_Rb_tree_header *)CacheEntry::GetProperty((CacheEntry *)(p_Var1 + 2),prop);
    val = p_Var3;
  }
  bVar2 = (byte)p_Var3;
  if (val != (_Rb_tree_header *)0x0) {
    bVar2 = cmSystemTools::IsOn((char *)val);
  }
  return (bool)(val != (_Rb_tree_header *)0x0 & bVar2);
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}